

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatcher.c
# Opt level: O0

void process_static_url(HttpRequest *req,HttpResponse *resp)

{
  api_url *paVar1;
  ssize_t sVar2;
  char local_2738 [4];
  int st;
  char buffer [10000];
  int file_fd;
  api_url *api_func;
  HttpResponse *resp_local;
  HttpRequest *req_local;
  
  if (req->method == GET) {
    paVar1 = api_funcs_get(req->url);
    if (paVar1 == (api_url *)0x0) {
      resp->status_code = 0x194;
      strcpy(resp->data,"<html><h4>404 not found</h4></html>");
    }
    else {
      buffer._9996_4_ = open(paVar1->path,0);
      if (buffer._9996_4_ == -1) {
        resp->status_code = 500;
        strcpy(resp->data,"<html><h4>500 server internal error</h4></html>");
      }
      else {
        sVar2 = read(buffer._9996_4_,local_2738,10000);
        local_2738[(int)sVar2] = '\0';
        strcpy(resp->data,local_2738);
        close(buffer._9996_4_);
        resp->status_code = 200;
      }
    }
  }
  else {
    resp->status_code = 400;
    strcpy(resp->data,"<html><h4>400 bad request</h4></html>");
  }
  return;
}

Assistant:

void process_static_url(HttpRequest *req, HttpResponse *resp) {

    if (req->method != GET) {
        BAD_RESPONSE(resp);
        return;
    }

    api_url *api_func = api_funcs_get(req->url);

    if (api_func == NULL) {
        NOT_FOUND_RESPONSE(resp);
        return;
    }

    int file_fd = open(api_func->path, O_RDONLY);
    if (file_fd == -1) {
        INTERNAL_ERROR_RESPONSE(resp);
        return;
    }

    char buffer[DATA_LENGTH];
    int st = read(file_fd, buffer, DATA_LENGTH);
    buffer[st] = '\0';
    strcpy(resp->data, buffer);
    close(file_fd);
    SUCCESS_RESPONSE(resp);
}